

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

string * __thiscall
t_d_generator::render_package_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_program *program)

{
  long lVar1;
  allocator local_75 [20];
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string package;
  t_program *program_local;
  t_d_generator *this_local;
  
  package.field_2._8_8_ = program;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"d",&local_61);
  t_program::get_namespace((string *)local_40,program,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_75);
    std::allocator<char>::~allocator((allocator<char> *)local_75);
  }
  else {
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"."
                  );
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string render_package(const t_program& program) const {
    string package = program.get_namespace("d");
    if (package.size() == 0)
      return "";
    return package + ".";
  }